

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_optimizer.hpp
# Opt level: O0

bool chaiscript::optimizer::
     contains_var_decl_in_scope<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
               (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *node
               )

{
  bool bVar1;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *pAVar2;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *node_00;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *child;
  size_t i;
  size_type num;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *node_local;
  
  if ((((node->super_AST_Node).identifier == Var_Decl) ||
      ((node->super_AST_Node).identifier == Assign_Decl)) ||
     ((node->super_AST_Node).identifier == Reference)) {
    node_local._7_1_ = true;
  }
  else {
    pAVar2 = (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
             child_count<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>(node);
    for (child = (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
                 0x0; child < pAVar2;
        child = (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
                ((long)&(child->super_AST_Node)._vptr_AST_Node + 1)) {
      node_00 = child_at<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
                          (node,(size_t)child);
      if ((((node_00->super_AST_Node).identifier != Block) &&
          ((node_00->super_AST_Node).identifier != For)) &&
         (((node_00->super_AST_Node).identifier != Ranged_For &&
          (bVar1 = contains_var_decl_in_scope<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
                             (node_00), bVar1)))) {
        return true;
      }
    }
    node_local._7_1_ = false;
  }
  return node_local._7_1_;
}

Assistant:

bool contains_var_decl_in_scope(const eval::AST_Node_Impl<T> &node) noexcept {
      if (node.identifier == AST_Node_Type::Var_Decl || node.identifier == AST_Node_Type::Assign_Decl
          || node.identifier == AST_Node_Type::Reference) {
        return true;
      }

      const auto num = child_count(node);

      for (size_t i = 0; i < num; ++i) {
        const auto &child = child_at(node, i);
        if (child.identifier != AST_Node_Type::Block && child.identifier != AST_Node_Type::For
            && child.identifier != AST_Node_Type::Ranged_For && contains_var_decl_in_scope(child)) {
          return true;
        }
      }

      return false;
    }